

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec.h
# Opt level: O0

void __thiscall bandit::reporter::spec::it_starting(spec *this,string *desc)

{
  ostream *poVar1;
  string local_38;
  string *local_18;
  string *desc_local;
  spec *this_local;
  
  local_18 = desc;
  desc_local = (string *)this;
  progress_base::it_starting((progress_base *)this,desc);
  poVar1 = (this->super_colored_base).stm_;
  indent_abi_cxx11_(&local_38,this);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  poVar1 = std::operator<<(poVar1,"- it ");
  poVar1 = std::operator<<(poVar1,(string *)local_18);
  std::operator<<(poVar1," ... ");
  std::__cxx11::string::~string((string *)&local_38);
  std::ostream::flush();
  return;
}

Assistant:

void it_starting(const std::string& desc) override {
        progress_base::it_starting(desc);
        stm_ << indent() << "- it " << desc << " ... ";
        stm_.flush();
      }